

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void duckdb::MinMaxNOperation::
     Combine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
               (ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::MinMaxFixedValue<int>,_duckdb::GreaterThan>
                *source,ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::MinMaxFixedValue<int>,_duckdb::GreaterThan>
                        *target,AggregateInputData *aggr_input)

{
  ArenaAllocator *pAVar1;
  InvalidInputException *this;
  STORAGE_TYPE *pSVar2;
  long lVar3;
  ulong uVar4;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (source->is_initialized == true) {
    if (target->is_initialized == false) {
      pAVar1 = aggr_input->allocator;
      (target->heap).capacity = (source->heap).capacity;
      pSVar2 = (STORAGE_TYPE *)duckdb::ArenaAllocator::AllocateAligned((ulong)pAVar1);
      memset(pSVar2,0,(target->heap).capacity << 3);
      (target->heap).heap = pSVar2;
      (target->heap).size = 0;
      target->is_initialized = true;
    }
    else if ((source->heap).capacity != (target->heap).capacity) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Mismatched n values in min/max/arg_min/arg_max","");
      duckdb::InvalidInputException::InvalidInputException(this,(string *)local_50);
      __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((source->heap).size != 0) {
      pAVar1 = aggr_input->allocator;
      lVar3 = 0;
      uVar4 = 0;
      do {
        pSVar2 = (source->heap).heap;
        BinaryAggregateHeap<int,_int,_duckdb::GreaterThan>::Insert
                  (&target->heap,pAVar1,(int *)((long)&(pSVar2->first).value + lVar3),
                   (int *)((long)&(pSVar2->second).value + lVar3));
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 8;
      } while (uVar4 < (source->heap).size);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &aggr_input) {
		if (!source.is_initialized) {
			// source is empty, nothing to do
			return;
		}

		if (!target.is_initialized) {
			target.Initialize(aggr_input.allocator, source.heap.Capacity());
		} else if (source.heap.Capacity() != target.heap.Capacity()) {
			throw InvalidInputException("Mismatched n values in min/max/arg_min/arg_max");
		}

		// Merge the heaps
		target.heap.Insert(aggr_input.allocator, source.heap);
	}